

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O0

Read<long> * __thiscall Omega_h::Read<long>::name_abi_cxx11_(Read<long> *this)

{
  string *psVar1;
  Write<long> *in_RSI;
  Read<signed_char> *this_local;
  
  psVar1 = Write<long>::name_abi_cxx11_(in_RSI);
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return this;
}

Assistant:

std::string name() const { return write_.name(); }